

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O1

bool __thiscall IntElemDomain<0,_0,_0>::propagate(IntElemDomain<0,_0,_0> *this)

{
  uint *puVar1;
  IntVar *pIVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  IntVar *pIVar9;
  _func_int **pp_Var10;
  int iVar11;
  Tchar *pTVar12;
  ulong uVar13;
  long lVar14;
  uint *puVar15;
  ulong uVar16;
  int iVar17;
  Tint *pTVar18;
  IntView<0> *pIVar19;
  ulong uVar20;
  int iVar21;
  TrailElem local_48;
  IntVar *local_38;
  
  pIVar9 = (this->y).var;
  iVar17 = (pIVar9->min).v;
  uVar20 = (ulong)iVar17;
  iVar11 = (pIVar9->max).v;
  bVar5 = iVar11 < iVar17;
  if (iVar17 <= iVar11) {
    do {
      if (((long)(pIVar9->min).v <= (long)uVar20) &&
         ((pIVar9->vals == (Tchar *)0x0 || (pIVar9->vals[uVar20].v != '\0')))) {
        pTVar18 = this->num_support;
        puVar1 = (uint *)this->support[uVar20];
        uVar6 = pTVar18[uVar20].v;
        if ((int)uVar6 < 1) {
          uVar13 = 0;
LAB_001a74b3:
          uVar7 = (uint)uVar13;
          if (uVar7 == uVar6) {
            if (so.lazy == true) {
              pIVar9 = (this->x).var;
              iVar11 = ((pIVar9->max).v - (pIVar9->min).v) + 4;
              local_48.pt = (int *)malloc((long)iVar11 * 4 + 8);
              ((Tint *)local_48.pt)->v = (((Tint *)local_48.pt)->v & 0xfcU) + iVar11 * 0x100 + 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_48);
              pTVar18 = (Tint *)local_48.pt;
              iVar11 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
              if ((uint)*&pTVar18->v < 0x200) {
LAB_001a79aa:
                abort();
              }
              ((Tint *)(&pTVar18->v + 2))->v = iVar11;
              iVar11 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
              if ((uint)*&pTVar18->v < 0x300) goto LAB_001a79aa;
              ((Tint *)(&pTVar18->v + 3))->v = iVar11;
              pIVar9 = (this->x).var;
              iVar11 = (pIVar9->min).v;
              if (iVar11 <= (pIVar9->max).v) {
                iVar17 = iVar11 + 3;
                uVar13 = (long)iVar11;
                do {
                  iVar11 = (pIVar9->min).v;
                  iVar21 = iVar17 - iVar11;
                  if (((long)uVar13 < (long)iVar11) ||
                     ((pIVar9->vals != (Tchar *)0x0 && (pIVar9->vals[uVar13].v == '\0')))) {
                    pp_Var10 = (pIVar9->super_Var).super_Branching._vptr_Branching;
                    uVar16 = uVar13;
                  }
                  else {
                    pIVar9 = (this->a).data[uVar13 & 0xffffffff].var;
                    pp_Var10 = (pIVar9->super_Var).super_Branching._vptr_Branching;
                    uVar16 = uVar20;
                  }
                  uVar6 = (*pp_Var10[0xd])(pIVar9,uVar16,0);
                  if ((int)((uint)*&pTVar18->v >> 8) <= iVar21) goto LAB_001a79aa;
                  ((Tint *)(&pTVar18->v + (long)iVar21 + 1))->v = uVar6 ^ 1;
                  pIVar9 = (this->x).var;
                  iVar17 = iVar17 + 1;
                  bVar4 = (long)uVar13 < (long)(pIVar9->max).v;
                  uVar13 = uVar13 + 1;
                } while (bVar4);
              }
            }
            else {
              pTVar18 = (Tint *)0x0;
            }
            pIVar9 = (this->y).var;
            bVar4 = true;
            iVar11 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0x11])
                               (pIVar9,uVar20,pTVar18,1);
            if ((char)iVar11 == '\0') goto LAB_001a76b0;
          }
          else {
            if (0 < (int)uVar7) {
              piVar3 = this->temp_sup;
              uVar16 = 0;
              do {
                piVar3[uVar16] = puVar1[uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar13 != uVar16);
            }
            pTVar18 = pTVar18 + uVar20;
            iVar11 = pTVar18->v;
            puVar15 = puVar1;
            uVar16 = uVar13;
            if ((int)uVar7 < iVar11) {
              do {
                *puVar15 = puVar15[uVar13];
                uVar16 = uVar16 + 1;
                iVar11 = pTVar18->v;
                puVar15 = puVar15 + 1;
              } while ((long)uVar16 < (long)iVar11);
            }
            if (0 < (int)uVar7) {
              piVar3 = this->temp_sup;
              uVar16 = 0;
              do {
                puVar1[(long)(int)(iVar11 - uVar7) + uVar16] = piVar3[uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar13 != uVar16);
            }
            local_48.x = pTVar18->v;
            iVar11 = local_48.x - uVar7;
            local_48.sz = 4;
            local_48.pt = &pTVar18->v;
            vec<TrailElem>::push(&engine.trail,&local_48);
            pTVar18->v = iVar11;
          }
          bVar4 = false;
        }
        else {
          uVar7 = *puVar1;
          pIVar9 = (this->x).var;
          iVar11 = (pIVar9->min).v;
          iVar17 = (pIVar9->max).v;
          if ((iVar17 < (int)uVar7 || (int)uVar7 < iVar11) ||
             ((((pIVar9->vals != (Tchar *)0x0 && (pIVar9->vals[(int)uVar7].v == '\0')) ||
               (pIVar2 = (this->a).data[uVar7].var, (long)uVar20 < (long)(pIVar2->min).v)) ||
              ((long)(pIVar2->max).v < (long)uVar20)))) {
LAB_001a73d8:
            uVar13 = 1;
            if (1 < (int)uVar6) {
              uVar13 = (ulong)uVar6;
            }
            uVar16 = 0;
            do {
              uVar7 = puVar1[uVar16];
              if (((((int)uVar7 <= iVar17 && iVar11 <= (int)uVar7) &&
                   ((pIVar9->vals == (Tchar *)0x0 || (pIVar9->vals[(int)uVar7].v != '\0')))) &&
                  (pIVar2 = (this->a).data[uVar7].var, (long)(pIVar2->min).v <= (long)uVar20)) &&
                 (((long)uVar20 <= (long)(pIVar2->max).v &&
                  ((pIVar2->vals == (Tchar *)0x0 || (pIVar2->vals[uVar20].v != '\0')))))) {
                uVar13 = uVar16 & 0xffffffff;
                break;
              }
              uVar16 = uVar16 + 1;
            } while (uVar13 != uVar16);
            goto LAB_001a74b3;
          }
          bVar4 = false;
          if ((pIVar2->vals != (Tchar *)0x0) && (pIVar2->vals[uVar20].v == '\0')) goto LAB_001a73d8;
        }
LAB_001a76b0:
        if (bVar4) {
          if (!bVar5) {
            return false;
          }
          break;
        }
      }
      pIVar9 = (this->y).var;
      lVar14 = (long)(pIVar9->max).v;
      bVar5 = lVar14 <= (long)uVar20;
      bVar4 = (long)uVar20 < lVar14;
      uVar20 = uVar20 + 1;
    } while (bVar4);
  }
  pIVar9 = (this->x).var;
  uVar6 = (pIVar9->min).v;
  if (uVar6 != (pIVar9->max).v) {
    return true;
  }
  pIVar19 = (this->a).data;
  pIVar9 = pIVar19[uVar6].var;
  iVar11 = (pIVar9->min).v;
  if ((((this->y).var)->min).v < iVar11) {
    if (so.lazy == true) {
      iVar17 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[8])();
      uVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar20 = (ulong)uVar7 << 0x20 | (long)iVar17 << 2 | 3;
    }
    else {
      uVar20 = 0;
    }
    pIVar9 = (this->y).var;
    iVar11 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xe])
                       (pIVar9,(long)iVar11,uVar20,1);
    if ((char)iVar11 == '\0') {
      return false;
    }
  }
  pIVar19 = pIVar19 + uVar6;
  pIVar9 = (this->y).var;
  iVar11 = (pIVar9->min).v;
  if ((pIVar19->var->min).v < iVar11) {
    if (so.lazy == true) {
      iVar17 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[8])();
      uVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar20 = (ulong)uVar7 << 0x20 | (long)iVar17 << 2 | 3;
    }
    else {
      uVar20 = 0;
    }
    iVar11 = (*(pIVar19->var->super_Var).super_Branching._vptr_Branching[0xe])
                       (pIVar19->var,(long)iVar11,uVar20,1);
    if ((char)iVar11 == '\0') {
      return false;
    }
  }
  iVar11 = (pIVar19->var->max).v;
  if (iVar11 < (((this->y).var)->max).v) {
    if (so.lazy == true) {
      iVar17 = (*(pIVar19->var->super_Var).super_Branching._vptr_Branching[9])();
      uVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar20 = (ulong)uVar7 << 0x20 | (long)iVar17 << 2 | 3;
    }
    else {
      uVar20 = 0;
    }
    pIVar9 = (this->y).var;
    iVar11 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xf])
                       (pIVar9,(long)iVar11,uVar20,1);
    if ((char)iVar11 == '\0') {
      return false;
    }
  }
  pIVar9 = (this->y).var;
  iVar11 = (pIVar9->max).v;
  if (iVar11 < (pIVar19->var->max).v) {
    if (so.lazy == true) {
      iVar17 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[9])();
      uVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar20 = (ulong)uVar7 << 0x20 | (long)iVar17 << 2 | 3;
    }
    else {
      uVar20 = 0;
    }
    iVar11 = (*(pIVar19->var->super_Var).super_Branching._vptr_Branching[0xf])
                       (pIVar19->var,(long)iVar11,uVar20,1);
    if ((char)iVar11 == '\0') {
      return false;
    }
  }
  pIVar19 = (this->a).data;
  pIVar9 = pIVar19[uVar6].var;
  iVar11 = (pIVar9->min).v;
  local_38 = pIVar9;
  do {
    iVar17 = -0x80000000;
    lVar14 = (long)iVar11;
    if (iVar11 != (pIVar9->max).v) {
      pTVar12 = pIVar9->vals + lVar14;
      iVar17 = iVar11;
      do {
        pTVar12 = pTVar12 + 1;
        iVar17 = iVar17 + 1;
      } while (pTVar12->v == '\0');
    }
    pIVar2 = (this->y).var;
    if (((iVar11 < (pIVar2->min).v) || ((pIVar2->max).v < iVar11)) ||
       ((pIVar2->vals != (Tchar *)0x0 && (pIVar2->vals[lVar14].v == '\0')))) {
      if (so.lazy == true) {
        uVar7 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xd])(pIVar2,lVar14,0);
        pIVar9 = (this->x).var;
        uVar8 = (*(pIVar9->super_Var).super_Branching._vptr_Branching[0xd])
                          (pIVar9,(long)(int)uVar6,1);
        uVar20 = (ulong)(uVar8 ^ 1) << 0x20 | (long)(int)(uVar7 ^ 1) << 2 | 3;
        pIVar9 = local_38;
      }
      else {
        uVar20 = 0;
      }
      iVar11 = (*((pIVar19[uVar6].var)->super_Var).super_Branching._vptr_Branching[0x11])
                         (pIVar19[uVar6].var,lVar14,uVar20,1);
      if ((char)iVar11 == '\0') {
        return false;
      }
    }
    pIVar19 = (this->a).data;
    iVar11 = iVar17;
  } while( true );
}

Assistant:

bool propagate() override {
		// propagate holes in y
		for (int v = static_cast<int>(y.getMin()); v <= static_cast<int>(y.getMax()); v++) {
			if (!y.indomain(v)) {
				continue;
			}
			int* s = support[v];
			int f = 0;
			if (num_support[v] > 0) {
				if (x.indomain(s[0]) && a[s[0]].indomain(v)) {
					continue;
				}
				while (!(x.indomain(s[f]) && a[s[f]].indomain(v)) && ++f < num_support[v]) {
					;
				}
			}
			if (f == num_support[v]) {
				// v has no support, remove from y
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(static_cast<int>(x.getMax() + 4 - x.getMin()));
					(*r)[1] = x.getMinLit();
					(*r)[2] = x.getMaxLit();
					for (int i = static_cast<int>(x.getMin()); i <= static_cast<int>(x.getMax()); i++) {
						const int reasonIndex = static_cast<int>(3 + i - x.getMin());
						if (x.indomain(i)) {
							const Lit l = ~a[i].getLit(v, LR_NE);
							(*r)[reasonIndex] = l;
						} else {
							const Lit l = ~x.getLit(i, LR_NE);
							(*r)[reasonIndex] = l;
						}
					}
				}
				if (!y.remVal(v, r)) {
					return false;
				}
			} else {
				// shift bad supports to back
				for (int i = 0; i < f; i++) {
					temp_sup[i] = s[i];
				}
				for (int i = f; i < num_support[v]; i++) {
					s[i - f] = s[i];
				}
				s += num_support[v] - f;
				for (int i = 0; i < f; i++) {
					s[i] = temp_sup[i];
				}
				num_support[v] -= f;
			}
		}

		// propagate holes in x
		// just ignore

		// propagate holes in a_i
		if (x.isFixed()) {
			const int v = static_cast<int>(x.getVal());
			const IntView<W>& f = a[v];
			setDom(y, setMin, f.getMin(), f.getMinLit(), x.getValLit());
			setDom(f, setMin, y.getMin(), y.getMinLit(), x.getValLit());
			setDom(y, setMax, f.getMax(), f.getMaxLit(), x.getValLit());
			setDom(f, setMax, y.getMax(), y.getMaxLit(), x.getValLit());
			for (typename IntView<W>::iterator i = a[v].begin(); i != a[v].end();) {
				const int w = *i++;
				if (!y.indomain(w) &&
						!a[v].remVal(w,
												 so.lazy ? Reason(~y.getLit(w, LR_NE), ~x.getLit(v, LR_EQ)) : Reason())) {
					return false;
				}
			}
		}

		return true;
	}